

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O3

Error * ot::commissioner::RestoreDirPath(Error *__return_storage_ptr__,string *aPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  size_type __pos;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar7;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  Error error;
  string path;
  writer write;
  string dirName;
  string baseName;
  undefined1 local_138 [8];
  _Alloc_hider _Stack_130;
  undefined1 local_128 [24];
  code *local_110;
  code *local_108;
  type local_100;
  char *local_f8;
  size_type local_f0;
  char local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  string local_d8;
  writer local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_f8 = &local_e8;
  local_100 = none_type;
  local_f0 = 0;
  local_e8 = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  pcVar3 = (aPath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar3,pcVar3 + aPath->_M_string_length);
  do {
    local_128._0_2_ = 0x2f;
    _Stack_130._M_p = (char *)0x1;
    local_138 = (undefined1  [8])local_128;
    pcVar5 = (char *)EndsWithAtPos(&local_d8,(string *)local_138);
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138);
    }
    if (pcVar5 == (char *)0xffffffffffffffff) {
      _Stack_130._M_p = (char *)0x2;
      local_128._0_3_ = 0x2e2f;
      local_138 = (undefined1  [8])local_128;
      pcVar5 = (char *)EndsWithAtPos(&local_d8,(string *)local_138);
      if (local_138 != (undefined1  [8])local_128) {
        operator_delete((void *)local_138);
      }
      if (pcVar5 == (char *)0xffffffffffffffff) {
        _Stack_130._M_p = (char *)0x3;
        local_128._0_4_ = 0x2e2e2f;
        local_138 = (undefined1  [8])local_128;
        pcVar5 = (char *)EndsWithAtPos(&local_d8,(string *)local_138);
        if (local_138 != (undefined1  [8])local_128) {
          operator_delete((void *)local_138);
        }
        if (pcVar5 == (char *)0xffffffffffffffff) break;
      }
    }
    local_d8._M_dataplus._M_p[(long)pcVar5] = '\0';
    local_d8._M_string_length = (size_type)pcVar5;
  } while( true );
  if ((char *)local_d8._M_string_length == (char *)0x0) {
    local_138._0_4_ = 0xd;
    _Stack_130._M_p = "Nothing to create for {}";
    local_128._0_8_ = (char *)0x18;
    local_128._8_8_ = 0x100000000;
    local_110 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar5 = "Nothing to create for {}";
    local_128._16_8_ = local_138;
    do {
      pcVar7 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar7 == "") || (*pcVar7 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar7 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar5,"",(format_string_checker<char> *)local_138);
      }
      pcVar5 = pcVar7;
    } while (pcVar7 != "");
    local_138 = (undefined1  [8])(aPath->_M_dataplus)._M_p;
    _Stack_130._M_p = (pointer)aPath->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x18;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_138;
    ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"Nothing to create for {}",fmt,args);
    __return_storage_ptr__->mCode = kAlreadyExists;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->mMessage,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_d8._M_dataplus._M_p,
               (char *)(local_d8._M_string_length + (long)local_d8._M_dataplus._M_p));
    PathExists((Error *)local_138,&local_50);
    local_100 = local_138._0_4_;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&_Stack_130);
    if (_Stack_130._M_p != local_128 + 8) {
      operator_delete(_Stack_130._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_100 == none_type) {
      __return_storage_ptr__->mCode = kNone;
LAB_001ed3e3:
      paVar1 = &(__return_storage_ptr__->mMessage).field_2;
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (local_f8 == &local_e8) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_e7,local_e8);
        *(undefined8 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 8) = uStack_e0;
      }
      else {
        (__return_storage_ptr__->mMessage)._M_dataplus._M_p = local_f8;
        (__return_storage_ptr__->mMessage).field_2._M_allocated_capacity =
             CONCAT71(uStack_e7,local_e8);
      }
      (__return_storage_ptr__->mMessage)._M_string_length = local_f0;
      local_f0 = 0;
      local_e8 = '\0';
      local_f8 = &local_e8;
      goto LAB_001ed56a;
    }
    SplitPath(&local_d8,&local_90,&local_70);
    if (local_90._M_string_length == 0) {
      local_138._0_4_ = 0xd;
      pcVar5 = "Path restoration impossible for path {}";
      _Stack_130._M_p = "Path restoration impossible for path {}";
      local_128._0_8_ = (char *)0x27;
      local_128._8_8_ = 0x100000000;
      local_110 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_128._16_8_ = local_138;
      local_b8.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
            *)local_138;
      do {
        cVar2 = *pcVar5;
        pcVar7 = pcVar5;
        while (cVar2 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&local_b8,pcVar5,"");
            goto LAB_001ed389;
          }
          cVar2 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_b8,pcVar5,pcVar7);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar7,"",(format_string_checker<char> *)local_138);
      } while (pcVar5 != "");
LAB_001ed389:
      local_138 = (undefined1  [8])(aPath->_M_dataplus)._M_p;
      _Stack_130._M_p = (pointer)aPath->_M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x27;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_138;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,(v10 *)"Path restoration impossible for path {}",fmt_00,args_00);
      __return_storage_ptr__->mCode = kRejected;
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mMessage).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->mMessage,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
    }
    else {
      RestoreDirPath((Error *)local_138,&local_90);
      local_100 = local_138._0_4_;
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&_Stack_130);
      if (_Stack_130._M_p != local_128 + 8) {
        operator_delete(_Stack_130._M_p);
      }
      if ((local_100 != none_type) && (local_100 != string_type)) {
        __return_storage_ptr__->mCode = local_100;
        goto LAB_001ed3e3;
      }
      iVar4 = mkdir(local_d8._M_dataplus._M_p,0x1f8);
      if (iVar4 != -1) {
        __return_storage_ptr__->mCode = kNone;
        (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->mMessage).field_2;
        (__return_storage_ptr__->mMessage)._M_string_length = 0;
        (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
        goto LAB_001ed56a;
      }
      local_138 = (undefined1  [8])0xc0000000d;
      pcVar5 = "Failed to create directory {}: {}";
      _Stack_130._M_p = "Failed to create directory {}: {}";
      local_128._0_8_ = 0x21;
      local_128._8_8_ = 0x200000000;
      local_110 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_108 = ::fmt::v10::detail::
                  parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      local_128._16_8_ = local_138;
      local_b8.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
            *)local_138;
      do {
        cVar2 = *pcVar5;
        pcVar7 = pcVar5;
        while (cVar2 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
            ::writer::operator()(&local_b8,pcVar5,"");
            goto LAB_001ed4eb;
          }
          cVar2 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
        ::writer::operator()(&local_b8,pcVar5,pcVar7);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                           (pcVar7,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                             *)local_138);
      } while (pcVar5 != "");
LAB_001ed4eb:
      piVar6 = __errno_location();
      local_128._0_8_ = strerror(*piVar6);
      local_138 = (undefined1  [8])local_d8._M_dataplus._M_p;
      _Stack_130._M_p = (pointer)local_d8._M_string_length;
      fmt_01.size_ = 0xcd;
      fmt_01.data_ = (char *)0x21;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_138;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,(v10 *)"Failed to create directory {}: {}",fmt_01,args_01);
      __return_storage_ptr__->mCode = kIOError;
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mMessage).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->mMessage,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
LAB_001ed56a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error RestoreDirPath(const std::string &aPath)
{
    std::string baseName;
    std::string dirName;
    Error       error;

    std::string path = aPath;
    RemoveTrailings(path);

    if (path.empty())
    {
        // Nothing to restore: everything possible is already present in the FS:
        // aPath is either the root directory or relative to the current directory without any named component.
        return ERROR_ALREADY_EXISTS("Nothing to create for {}", aPath);
    }

    // Check path exists
    error = PathExists(path);
    if (error == ERROR_NONE)
    {
        return error;
    }

    SplitPath(path, dirName, baseName);
    if (dirName.empty())
    {
        // (baseName == path) => it is already known the path restoration is impossible (from the caller level)
        return ERROR_REJECTED("Path restoration impossible for path {}", aPath);
    }

    error = RestoreDirPath(dirName);
    if (error.GetCode() != ErrorCode::kNone && error.GetCode() != ErrorCode::kAlreadyExists)
    {
        return error;
    }

    int result = mkdir(path.c_str(), 0770);
    if (result == -1)
    {
        return ERROR_IO_ERROR("Failed to create directory {}: {}", path, strerror(errno));
    }

    return ERROR_NONE;
}